

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitRandomTest_x_iutest_x_Size64_Test::Body(iu_UnitRandomTest_x_iutest_x_Size64_Test *this)

{
  UInt64 UVar1;
  unsigned_long (*in_R9) [10];
  int i;
  long lVar2;
  iuRandom r;
  AssertionResult iutest_ar;
  iuCodeMessage local_268;
  UInt64 y [10];
  UInt64 x [10];
  Fixed local_198;
  
  iutest::detail::iuRandom::iuRandom(&r);
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    UVar1 = iutest::detail::iuRandom::genrand<unsigned_long>(&r);
    x[lVar2] = UVar1 >> 0x20;
  }
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    UVar1 = iutest::detail::iuRandom::genrand<unsigned_long>(&r);
    y[lVar2] = UVar1 >> 0x20;
  }
  iuutil::CmpHelperNeRange<unsigned_long[10],unsigned_long[10]>
            (&iutest_ar,(iuutil *)0x169bcd,"y",(char *)x,(unsigned_long (*) [10])y,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
               ,0x44,iutest_ar.m_message._M_dataplus._M_p);
    local_268._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,&local_198);
    std::__cxx11::string::~string((string *)&local_268);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(UnitRandomTest, Size64)
{
    ::iutest::detail::iuRandom r;
    iutest::UInt64 x[10];
    for( int i=0; i < 10; ++i)
    {
        x[i] = r.genrand<iutest::UInt64>() >> 32;
    }
    iutest::UInt64 y[10];
    for( int i=0; i < 10; ++i)
    {
        y[i] = r.genrand<iutest::UInt64>() >> 32;
    }
    IUTEST_EXPECT_NE_RANGE(x, y);
}